

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

uint __thiscall sjtu::TrainManager::bitset_newblock(TrainManager *this,uint y)

{
  uint uVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  uint in_ESI;
  uint bit;
  int i;
  uint ret;
  ofstream bitset;
  int local_23c;
  uint local_238;
  fpos local_228 [20];
  uint local_214;
  char local_210 [516];
  uint local_c;
  
  local_c = in_ESI;
  _Var2 = std::operator|(_S_out,_S_app);
  std::ofstream::ofstream(local_210,"Bitset.dat",_Var2);
  local_228._0_16_ = std::ostream::tellp();
  uVar3 = std::fpos::operator_cast_to_long(local_228);
  local_214 = (uint)(uVar3 >> 0xb);
  for (local_238 = 0; uVar1 = local_214, (int)local_238 < 0x200; local_238 = local_238 + 1) {
    local_23c = (uint)(local_238 == local_c >> 5) << ((byte)local_c & 0x1f);
    std::ostream::write(local_210,(long)&local_23c);
  }
  std::ofstream::~ofstream(local_210);
  return uVar1;
}

Assistant:

unsigned int bitset_newblock(unsigned int y)
		{
			std::ofstream bitset("Bitset.dat" , std::ios_base::out | std::ios_base::app);
			unsigned int ret = bitset.tellp() / sizeof (unsigned int) / WS;
			for (int i = 0;i < WS;++ i)
			{
				unsigned int bit = (i == y / W) << y % W;
				bitset.write(reinterpret_cast<char *> (&bit) , sizeof (unsigned int));
			}
			return ret;
		}